

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerResults.cpp
# Opt level: O0

void __thiscall
I2sAnalyzerResults::GenerateFrameTabularText
          (I2sAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char *pcVar1;
  char local_4d8 [8];
  char bits_per_word [32];
  stringstream local_498 [8];
  stringstream ss_1;
  ostream local_488 [376];
  longlong local_310;
  S64 signed_number_1;
  char number_str_1 [128];
  stringstream local_268 [8];
  stringstream ss;
  ostream local_258 [392];
  longlong local_d0;
  S64 signed_number;
  char number_str [128];
  Frame frame;
  ulonglong local_38;
  undefined1 local_28;
  DisplayBase display_base_local;
  U64 frame_index_local;
  I2sAnalyzerResults *this_local;
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)(number_str + 0x78));
  switch(local_28) {
  case 0:
    if ((display_base == Decimal) && (this->mSettings->mSigned == SignedInteger)) {
      local_d0 = AnalyzerHelpers::ConvertToSignedNumber(local_38,this->mSettings->mBitsPerWord);
      std::__cxx11::stringstream::stringstream(local_268);
      std::ostream::operator<<(local_258,local_d0);
      std::__cxx11::stringstream::str();
      pcVar1 = (char *)std::__cxx11::string::c_str();
      strcpy((char *)&signed_number,pcVar1);
      std::__cxx11::string::~string((string *)(number_str_1 + 0x78));
      std::__cxx11::stringstream::~stringstream(local_268);
    }
    else {
      AnalyzerHelpers::GetNumberString
                (local_38,display_base,this->mSettings->mBitsPerWord,(char *)&signed_number,0x80);
    }
    AnalyzerResults::AddTabularText
              ((char *)this,"Ch 1: ",(char *)&signed_number,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 1:
    if ((display_base == Decimal) && (this->mSettings->mSigned == SignedInteger)) {
      local_310 = AnalyzerHelpers::ConvertToSignedNumber(local_38,this->mSettings->mBitsPerWord);
      std::__cxx11::stringstream::stringstream(local_498);
      std::ostream::operator<<(local_488,local_310);
      std::__cxx11::stringstream::str();
      pcVar1 = (char *)std::__cxx11::string::c_str();
      strcpy((char *)&signed_number_1,pcVar1);
      std::__cxx11::string::~string((string *)(bits_per_word + 0x18));
      std::__cxx11::stringstream::~stringstream(local_498);
    }
    else {
      AnalyzerHelpers::GetNumberString
                (local_38,display_base,this->mSettings->mBitsPerWord,(char *)&signed_number_1,0x80);
    }
    AnalyzerResults::AddTabularText
              ((char *)this,"Ch 2: ",(char *)&signed_number_1,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 2:
    sprintf(local_4d8,"%d",(ulong)this->mSettings->mBitsPerWord);
    AnalyzerResults::AddTabularText
              ((char *)this,"Error: too few bits, expecting ",local_4d8,(char *)0x0,(char *)0x0,
               (char *)0x0);
    break;
  case 3:
    AnalyzerResults::AddTabularText
              ((char *)this,"Error: bits don\'t divide evenly between subframes",(char *)0x0,
               (char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame((Frame *)(number_str + 0x78));
  return;
}

Assistant:

void I2sAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    switch( I2sResultType( frame.mType ) )
    {
    case Channel1:
    {
        char number_str[ 128 ];
        if( ( display_base == Decimal ) && ( mSettings->mSigned == AnalyzerEnums::SignedInteger ) )
        {
            S64 signed_number = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
            std::stringstream ss;
            ss << signed_number;
            strcpy( number_str, ss.str().c_str() );
        }
        else
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerWord, number_str, 128 );
        }

        AddTabularText( "Ch 1: ", number_str );
    }
    break;
    case Channel2:
    {
        char number_str[ 128 ];
        if( ( display_base == Decimal ) && ( mSettings->mSigned == AnalyzerEnums::SignedInteger ) )
        {
            S64 signed_number = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
            std::stringstream ss;
            ss << signed_number;
            strcpy( number_str, ss.str().c_str() );
        }
        else
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerWord, number_str, 128 );
        }

        AddTabularText( "Ch 2: ", number_str );
    }
    break;
    case ErrorTooFewBits:
    {
        char bits_per_word[ 32 ];
        sprintf( bits_per_word, "%d", mSettings->mBitsPerWord );

        AddTabularText( "Error: too few bits, expecting ", bits_per_word );
    }
    break;
    case ErrorDoesntDivideEvenly:
    {
        AddTabularText( "Error: bits don't divide evenly between subframes" );
    }
    break;
    }
}